

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::init_frame(jpeg_decoder *this)

{
  uint uVar1;
  sbyte sVar2;
  undefined1 auVar3 [16];
  int iVar4;
  uint8 *puVar5;
  jpgd_block_t *pjVar6;
  long lVar7;
  uint uVar8;
  undefined8 uVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  long lVar13;
  
  if (this->m_comps_in_frame == 3) {
    if ((((this->m_comp_h_samp[1] != 1) || (this->m_comp_v_samp[1] != 1)) ||
        (this->m_comp_h_samp[2] != 1)) || (this->m_comp_v_samp[2] != 1)) goto LAB_001528c3;
    uVar8 = this->m_comp_h_samp[0];
    uVar1 = this->m_comp_v_samp[0];
    if ((uVar8 ^ 1) == 0 && (uVar1 ^ 1) == 0) {
      uVar9 = 0x800000008;
      iVar4 = 3;
      iVar11 = 1;
    }
    else {
      iVar4 = 4;
      if (uVar8 == 2 && (uVar1 ^ 1) == 0) {
        uVar9 = 0x800000010;
        iVar11 = 2;
      }
      else if ((uVar8 ^ 1) == 0 && uVar1 == 2) {
        uVar9 = 0x1000000008;
        iVar11 = 3;
      }
      else {
        if ((uVar8 != 2) || (uVar1 != 2)) goto LAB_001528c3;
        uVar9 = 0x1000000010;
        iVar4 = 6;
        iVar11 = 4;
      }
    }
  }
  else {
    if (this->m_comps_in_frame != 1) {
      stop_decoding(this,JPGD_UNSUPPORTED_COLORSPACE);
    }
    if ((this->m_comp_h_samp[0] != 1) || (this->m_comp_v_samp[0] != 1)) {
LAB_001528c3:
      stop_decoding(this,JPGD_UNSUPPORTED_SAMP_FACTORS);
    }
    iVar11 = 0;
    uVar9 = 0x800000008;
    iVar4 = 1;
  }
  this->m_scan_type = iVar11;
  this->m_max_blocks_per_mcu = iVar4;
  this->m_max_mcu_x_size = (int)uVar9;
  this->m_max_mcu_y_size = (int)((ulong)uVar9 >> 0x20);
  iVar4 = this->m_image_x_size;
  this->m_max_mcus_per_row = (iVar4 + (int)uVar9 + -1) / (int)uVar9;
  sVar2 = (iVar11 != 0) * '\x02';
  uVar8 = (iVar4 + 0xfU & 0xfff0) << sVar2;
  this->m_max_mcus_per_col =
       (this->m_image_y_size + this->m_max_mcu_y_size + -1) / this->m_max_mcu_y_size;
  this->m_dest_bytes_per_pixel = (uint)(iVar11 != 0) * 3 + 1;
  this->m_dest_bytes_per_scan_line = uVar8;
  this->m_real_dest_bytes_per_scan_line = iVar4 << sVar2;
  puVar5 = (uint8 *)alloc(this,(ulong)uVar8,true);
  this->m_pScan_line_0 = puVar5;
  if (this->m_scan_type - 3U < 2) {
    puVar5 = (uint8 *)alloc(this,(long)this->m_dest_bytes_per_scan_line,true);
    this->m_pScan_line_1 = puVar5;
  }
  iVar4 = this->m_max_mcus_per_row * this->m_max_blocks_per_mcu;
  this->m_max_blocks_per_row = iVar4;
  if (0x4000 < iVar4) {
    stop_decoding(this,JPGD_DECODE_ERROR);
  }
  pjVar6 = (jpgd_block_t *)alloc(this,(long)this->m_max_blocks_per_mcu << 7,false);
  this->m_pMCU_coefficients = pjVar6;
  auVar3 = _DAT_00181500;
  iVar4 = this->m_max_blocks_per_mcu;
  if (0 < (long)iVar4) {
    lVar7 = (long)iVar4 + -1;
    auVar10._8_4_ = (int)lVar7;
    auVar10._0_8_ = lVar7;
    auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
    lVar7 = 0;
    auVar10 = auVar10 ^ _DAT_00181500;
    auVar12 = _DAT_0018f4a0;
    auVar14 = _DAT_001814f0;
    do {
      auVar15 = auVar14 ^ auVar3;
      iVar11 = auVar10._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar11 && auVar10._0_4_ < auVar15._0_4_ ||
                  iVar11 < auVar15._4_4_) & 1)) {
        *(undefined4 *)((long)this->m_mcu_block_max_zag + lVar7) = 0x40;
      }
      if ((auVar15._12_4_ != auVar10._12_4_ || auVar15._8_4_ <= auVar10._8_4_) &&
          auVar15._12_4_ <= auVar10._12_4_) {
        *(undefined4 *)((long)this->m_mcu_block_max_zag + lVar7 + 4) = 0x40;
      }
      auVar15 = auVar12 ^ auVar3;
      iVar16 = auVar15._4_4_;
      if (iVar16 <= iVar11 && (iVar16 != iVar11 || auVar15._0_4_ <= auVar10._0_4_)) {
        *(undefined4 *)((long)this->m_mcu_block_max_zag + lVar7 + 8) = 0x40;
        *(undefined4 *)((long)this->m_mcu_block_max_zag + lVar7 + 0xc) = 0x40;
      }
      lVar13 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar13 + 4;
      lVar13 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar13 + 4;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)(iVar4 + 3U >> 2) << 4 != lVar7);
  }
  puVar5 = (uint8 *)alloc(this,(long)this->m_max_blocks_per_row << 6,false);
  this->m_pSample_buf = puVar5;
  puVar5 = (uint8 *)alloc(this,(long)this->m_max_blocks_per_row << 6,false);
  this->m_pSample_buf_prev = puVar5;
  this->m_total_lines_left = this->m_image_y_size;
  this->m_mcu_lines_left = 0;
  create_look_ups(this);
  return;
}

Assistant:

void jpeg_decoder::init_frame()
	{
		int i;

		if (m_comps_in_frame == 1)
		{
			if ((m_comp_h_samp[0] != 1) || (m_comp_v_samp[0] != 1))
				stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);

			m_scan_type = JPGD_GRAYSCALE;
			m_max_blocks_per_mcu = 1;
			m_max_mcu_x_size = 8;
			m_max_mcu_y_size = 8;
		}
		else if (m_comps_in_frame == 3)
		{
			if (((m_comp_h_samp[1] != 1) || (m_comp_v_samp[1] != 1)) ||
				((m_comp_h_samp[2] != 1) || (m_comp_v_samp[2] != 1)))
				stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);

			if ((m_comp_h_samp[0] == 1) && (m_comp_v_samp[0] == 1))
			{
				m_scan_type = JPGD_YH1V1;

				m_max_blocks_per_mcu = 3;
				m_max_mcu_x_size = 8;
				m_max_mcu_y_size = 8;
			}
			else if ((m_comp_h_samp[0] == 2) && (m_comp_v_samp[0] == 1))
			{
				m_scan_type = JPGD_YH2V1;
				m_max_blocks_per_mcu = 4;
				m_max_mcu_x_size = 16;
				m_max_mcu_y_size = 8;
			}
			else if ((m_comp_h_samp[0] == 1) && (m_comp_v_samp[0] == 2))
			{
				m_scan_type = JPGD_YH1V2;
				m_max_blocks_per_mcu = 4;
				m_max_mcu_x_size = 8;
				m_max_mcu_y_size = 16;
			}
			else if ((m_comp_h_samp[0] == 2) && (m_comp_v_samp[0] == 2))
			{
				m_scan_type = JPGD_YH2V2;
				m_max_blocks_per_mcu = 6;
				m_max_mcu_x_size = 16;
				m_max_mcu_y_size = 16;
			}
			else
				stop_decoding(JPGD_UNSUPPORTED_SAMP_FACTORS);
		}
		else
			stop_decoding(JPGD_UNSUPPORTED_COLORSPACE);

		m_max_mcus_per_row = (m_image_x_size + (m_max_mcu_x_size - 1)) / m_max_mcu_x_size;
		m_max_mcus_per_col = (m_image_y_size + (m_max_mcu_y_size - 1)) / m_max_mcu_y_size;

		// These values are for the *destination* pixels: after conversion.
		if (m_scan_type == JPGD_GRAYSCALE)
			m_dest_bytes_per_pixel = 1;
		else
			m_dest_bytes_per_pixel = 4;

		m_dest_bytes_per_scan_line = ((m_image_x_size + 15) & 0xFFF0) * m_dest_bytes_per_pixel;

		m_real_dest_bytes_per_scan_line = (m_image_x_size * m_dest_bytes_per_pixel);

		// Initialize two scan line buffers.
		m_pScan_line_0 = (uint8*)alloc(m_dest_bytes_per_scan_line, true);
		if ((m_scan_type == JPGD_YH1V2) || (m_scan_type == JPGD_YH2V2))
			m_pScan_line_1 = (uint8*)alloc(m_dest_bytes_per_scan_line, true);

		m_max_blocks_per_row = m_max_mcus_per_row * m_max_blocks_per_mcu;

		// Should never happen
		if (m_max_blocks_per_row > JPGD_MAX_BLOCKS_PER_ROW)
			stop_decoding(JPGD_DECODE_ERROR);

		// Allocate the coefficient buffer, enough for one MCU
		m_pMCU_coefficients = (jpgd_block_t*)alloc(m_max_blocks_per_mcu * 64 * sizeof(jpgd_block_t));

		for (i = 0; i < m_max_blocks_per_mcu; i++)
			m_mcu_block_max_zag[i] = 64;

		m_pSample_buf = (uint8*)alloc(m_max_blocks_per_row * 64);
		m_pSample_buf_prev = (uint8*)alloc(m_max_blocks_per_row * 64);

		m_total_lines_left = m_image_y_size;

		m_mcu_lines_left = 0;

		create_look_ups();
	}